

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
           *this)

{
  ulong capacity;
  slot_type *pptVar1;
  slot_type ptVar2;
  undefined1 auVar3 [16];
  size_t pos;
  size_t sVar4;
  size_t sVar5;
  byte bVar6;
  size_t new_capacity;
  FindInfo FVar7;
  size_t hashval;
  anon_class_16_2_f7bee600 probe_index;
  
  capacity = this->capacity_;
  if ((capacity == 0) || ((capacity + 1 & capacity) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>, phmap::priv::(anonymous namespace)::NonMovableKeyHash, phmap::priv::(anonymous namespace)::NonMovableKeyEq, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>>::drop_deletes_without_resize() [Policy = phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>, Hash = phmap::priv::(anonymous namespace)::NonMovableKeyHash, Eq = phmap::priv::(anonymous namespace)::NonMovableKeyEq, Alloc = std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>]"
                 );
  }
  if (capacity < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>, phmap::priv::(anonymous namespace)::NonMovableKeyHash, phmap::priv::(anonymous namespace)::NonMovableKeyEq, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>>::drop_deletes_without_resize() [Policy = phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>, Hash = phmap::priv::(anonymous namespace)::NonMovableKeyHash, Eq = phmap::priv::(anonymous namespace)::NonMovableKeyEq, Alloc = std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>]"
                 );
  }
  ConvertDeletedToEmptyAndFullToDeleted(this->ctrl_,capacity);
  new_capacity = 0;
  do {
    if (new_capacity == this->capacity_) {
      reset_growth_left(this,new_capacity);
      return;
    }
    if (this->ctrl_[new_capacity] == -2) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)(this->slots_[new_capacity]->first).i;
      hashval = SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0);
      FVar7 = find_first_non_full(this,hashval);
      pos = FVar7.offset;
      probe_index.this = this;
      probe_index.hashval = &hashval;
      sVar4 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()(&probe_index,pos);
      sVar5 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                        (&probe_index,new_capacity);
      bVar6 = (byte)hashval;
      if (sVar4 == sVar5) {
        bVar6 = bVar6 & 0x7f;
      }
      else {
        if (this->ctrl_[pos] == -2) {
          set_ctrl(this,pos,bVar6 & 0x7f);
          pptVar1 = this->slots_;
          ptVar2 = pptVar1[new_capacity];
          pptVar1[new_capacity] = pptVar1[pos];
          this->slots_[pos] = ptVar2;
          new_capacity = new_capacity - 1;
          goto LAB_0011d460;
        }
        if (this->ctrl_[pos] != -0x80) {
          __assert_fail("IsDeleted(ctrl_[new_i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x853,
                        "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>, phmap::priv::(anonymous namespace)::NonMovableKeyHash, phmap::priv::(anonymous namespace)::NonMovableKeyEq, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>>::drop_deletes_without_resize() [Policy = phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>, Hash = phmap::priv::(anonymous namespace)::NonMovableKeyHash, Eq = phmap::priv::(anonymous namespace)::NonMovableKeyEq, Alloc = std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>]"
                       );
        }
        set_ctrl(this,pos,bVar6 & 0x7f);
        this->slots_[pos] = this->slots_[new_capacity];
        bVar6 = 0x80;
      }
      set_ctrl(this,new_capacity,bVar6);
    }
LAB_0011d460:
    new_capacity = new_capacity + 1;
  } while( true );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                 PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hashval);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hashval.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hashval));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hashval));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left(capacity_);
    }